

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::geometry::anon_unknown_0::GeometryOutputCountTest::createInstance
          (GeometryOutputCountTest *this,Context *context)

{
  pointer piVar1;
  pointer piVar2;
  pointer pVVar3;
  GeometryExpanderRenderTestInstance *this_00;
  long lVar4;
  int ndx;
  ulong uVar5;
  int iVar6;
  float fVar7;
  undefined4 uVar8;
  
  this_00 = (GeometryExpanderRenderTestInstance *)operator_new(0x78);
  piVar1 = (this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar2 = (this->m_pattern).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  GeometryExpanderRenderTestInstance::GeometryExpanderRenderTestInstance
            (this_00,context,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,
             (this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__GeometryExpanderRenderTestInstance_00bf4e58;
  iVar6 = (int)((ulong)((long)piVar1 - (long)piVar2) >> 2);
  *(int *)&this_00[1].super_TestInstance._vptr_TestInstance = iVar6;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this_00->m_vertexPosData,(long)iVar6);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this_00->m_vertexAttrData,
             (long)*(int *)&this_00[1].super_TestInstance._vptr_TestInstance);
  lVar4 = 8;
  for (uVar5 = 0; iVar6 = *(int *)&this_00[1].super_TestInstance._vptr_TestInstance,
      (long)uVar5 < (long)iVar6; uVar5 = uVar5 + 1) {
    fVar7 = (float)(int)uVar5 / (float)iVar6;
    pVVar3 = (this_00->m_vertexPosData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)pVVar3->m_data + lVar4 + -8) = 0xbf800000;
    *(float *)((long)pVVar3->m_data + lVar4 + -4) = fVar7 + fVar7 + -1.0;
    *(undefined8 *)((long)pVVar3->m_data + lVar4) = 0x3f80000000000000;
    uVar8 = 0x3f800000;
    if ((uVar5 & 1) != 0) {
      uVar8 = 0;
    }
    pVVar3 = (this_00->m_vertexAttrData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)pVVar3->m_data + lVar4 + -8) = 0x3f800000;
    *(undefined4 *)((long)pVVar3->m_data + lVar4 + -4) = uVar8;
    *(undefined4 *)((long)pVVar3->m_data + lVar4) = uVar8;
    *(undefined4 *)((long)pVVar3->m_data + lVar4 + 4) = 0x3f800000;
    lVar4 = lVar4 + 0x10;
  }
  this_00->m_numDrawVertices = iVar6;
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* GeometryOutputCountTest::createInstance (Context& context) const
{
	return new GeometryOutputCountTestInstance (context, VK_PRIMITIVE_TOPOLOGY_POINT_LIST, static_cast<int>(m_pattern.size()), getName());
}